

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O1

bool bssl::anon_unknown_1::VerifyNameMatchInternal(Input a,Input b,NameMatchType match_type)

{
  pointer __src;
  X509NameAttribute attribute;
  X509NameAttribute attribute_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer __dest;
  pointer pXVar4;
  RelativeDistinguishedName b_type_and_values;
  string b_normalized;
  string a_normalized;
  RelativeDistinguishedName a_type_and_values;
  Parser a_rdn;
  Parser b_rdn_sequence;
  Parser a_rdn_sequence;
  Parser b_rdn_sequence_counter;
  Parser a_rdn_sequence_counter;
  Parser b_rdn;
  RelativeDistinguishedName local_218;
  pointer local_200;
  string local_1f8;
  string local_1d8;
  RelativeDistinguishedName local_1b8;
  uchar *local_198;
  size_t sStack_190;
  undefined8 local_188;
  uchar *puStack_180;
  size_t local_178;
  uchar *local_168;
  size_t sStack_160;
  undefined8 local_158;
  uchar *puStack_150;
  size_t local_148;
  uchar *local_138;
  size_t sStack_130;
  undefined8 local_128;
  uchar *puStack_120;
  size_t local_118;
  Parser local_108;
  Parser local_f0;
  Parser local_d8;
  Parser local_c0;
  Parser local_a8;
  CertErrors local_90;
  uchar *local_78;
  size_t sStack_70;
  undefined8 local_68;
  uchar *puStack_60;
  size_t local_58;
  Parser local_48;
  
  local_200 = (pointer)CONCAT44(local_200._4_4_,match_type);
  bssl::der::Parser::Parser(&local_a8,a);
  bssl::der::Parser::Parser(&local_c0,b);
  while ((bVar1 = bssl::der::Parser::HasMore(&local_a8), bVar1 &&
         (bVar1 = bssl::der::Parser::HasMore(&local_c0), bVar1))) {
    bVar1 = bssl::der::Parser::SkipTag(&local_a8,0x20000011);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::SkipTag(&local_c0,0x20000011);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = bssl::der::Parser::HasMore(&local_c0);
  if (bVar1) {
    return false;
  }
  if (((int)local_200 == 0) && (bVar1 = bssl::der::Parser::HasMore(&local_a8), bVar1)) {
    return false;
  }
  bssl::der::Parser::Parser(&local_d8,a);
  bssl::der::Parser::Parser(&local_f0,b);
  do {
    bVar1 = bssl::der::Parser::HasMore(&local_d8);
    if (!bVar1) {
      return true;
    }
    bVar1 = bssl::der::Parser::HasMore(&local_f0);
    if (!bVar1) {
      return true;
    }
    bssl::der::Parser::Parser(&local_108);
    bssl::der::Parser::Parser(&local_48);
    bVar1 = bssl::der::Parser::ReadConstructed(&local_d8,0x20000011,&local_108);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::ReadConstructed(&local_f0,0x20000011,&local_48);
    if (!bVar1) {
      return false;
    }
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = ReadRdn(&local_108,&local_1b8);
    if (((bVar1) && (bVar1 = ReadRdn(&local_48,&local_218), bVar1)) &&
       ((long)local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)local_218.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_218.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)) {
      local_200 = local_1b8.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar1 = local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      if (!bVar1) {
        bVar1 = false;
        __dest = local_218.
                 super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pXVar4 = local_1b8.
                 super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          for (; __dest != local_218.
                           super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                           ._M_impl.super__Vector_impl_data._M_finish; __dest = __dest + 1) {
            bVar2 = bssl::der::operator==((Input)(pXVar4->type).data_,(Input)(__dest->type).data_);
            if (bVar2) {
              local_148 = (pXVar4->value).data_.size_;
              local_168 = (pXVar4->type).data_.data_;
              sStack_160 = (pXVar4->type).data_.size_;
              local_158 = *(undefined8 *)&pXVar4->value_tag;
              puStack_150 = (pXVar4->value).data_.data_;
              local_198 = (__dest->type).data_.data_;
              sStack_190 = (__dest->type).data_.size_;
              local_188 = *(undefined8 *)&__dest->value_tag;
              puStack_180 = (__dest->value).data_.data_;
              local_178 = (__dest->value).data_.size_;
              local_138 = local_168;
              sStack_130 = sStack_160;
              local_128 = local_158;
              puStack_120 = puStack_150;
              local_118 = local_148;
              local_78 = local_198;
              sStack_70 = sStack_190;
              local_68 = local_188;
              puStack_60 = puStack_180;
              local_58 = local_178;
              if ((((uint)local_158 < 0x1f) && ((0x50481000U >> ((uint)local_158 & 0x1f) & 1) != 0))
                 && (((uint)local_188 < 0x1f && ((0x50481000U >> ((uint)local_188 & 0x1f) & 1) != 0)
                     ))) {
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                local_1d8._M_string_length = 0;
                local_1d8.field_2._M_local_buf[0] = '\0';
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                local_1f8._M_string_length = 0;
                local_1f8.field_2._M_local_buf[0] = '\0';
                CertErrors::CertErrors(&local_90);
                attribute.type.data_.size_ = sStack_160;
                attribute.type.data_.data_ = local_168;
                attribute._16_8_ = local_158;
                attribute.value.data_.data_ = puStack_150;
                attribute.value.data_.size_ = local_148;
                bVar2 = NormalizeValue(attribute,&local_1d8,&local_90);
                if (((bVar2) &&
                    (attribute_00.type.data_.size_ = sStack_190,
                    attribute_00.type.data_.data_ = local_198, attribute_00._16_8_ = local_188,
                    attribute_00.value.data_.data_ = puStack_180,
                    attribute_00.value.data_.size_ = local_178,
                    bVar2 = NormalizeValue(attribute_00,&local_1f8,&local_90), bVar2)) &&
                   (local_1d8._M_string_length == local_1f8._M_string_length)) {
                  if (local_1d8._M_string_length == 0) {
                    bVar2 = true;
                  }
                  else {
                    iVar3 = bcmp(local_1d8._M_dataplus._M_p,local_1f8._M_dataplus._M_p,
                                 local_1d8._M_string_length);
                    bVar2 = iVar3 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                CertErrors::~CertErrors(&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                           local_1f8.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                           local_1d8.field_2._M_local_buf[0]) + 1);
                }
              }
              else {
                if ((uint)local_158 != (uint)local_188) goto LAB_004c5256;
                bVar2 = bssl::der::operator==
                                  ((Input)(pXVar4->value).data_,(Input)(__dest->value).data_);
              }
              if (bVar2 != false) break;
            }
LAB_004c5256:
          }
          if (__dest == local_218.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_finish) break;
          __src = __dest + 1;
          if (__src != local_218.
                       super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
            memmove(__dest,__src,
                    (long)local_218.
                          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
          }
          local_218.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_218.
               super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          pXVar4 = pXVar4 + 1;
          bVar1 = pXVar4 == local_200;
          __dest = local_218.
                   super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (!bVar1);
      }
    }
    else {
      bVar1 = false;
    }
    if (local_218.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_218.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b8.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool VerifyNameMatchInternal(der::Input a, der::Input b,
                             NameMatchType match_type) {
  // Empty Names are allowed.  RFC 5280 section 4.1.2.4 requires "The issuer
  // field MUST contain a non-empty distinguished name (DN)", while section
  // 4.1.2.6 allows for the Subject to be empty in certain cases. The caller is
  // assumed to have verified those conditions.

  // RFC 5280 section 7.1:
  // Two distinguished names DN1 and DN2 match if they have the same number of
  // RDNs, for each RDN in DN1 there is a matching RDN in DN2, and the matching
  // RDNs appear in the same order in both DNs.

  // As an optimization, first just compare the number of RDNs:
  der::Parser a_rdn_sequence_counter(a);
  der::Parser b_rdn_sequence_counter(b);
  while (a_rdn_sequence_counter.HasMore() && b_rdn_sequence_counter.HasMore()) {
    if (!a_rdn_sequence_counter.SkipTag(CBS_ASN1_SET) ||
        !b_rdn_sequence_counter.SkipTag(CBS_ASN1_SET)) {
      return false;
    }
  }
  // If doing exact match and either of the sequences has more elements than the
  // other, not a match. If doing a subtree match, the first Name may have more
  // RDNs than the second.
  if (b_rdn_sequence_counter.HasMore()) {
    return false;
  }
  if (match_type == EXACT_MATCH && a_rdn_sequence_counter.HasMore()) {
    return false;
  }

  // Verify that RDNs in |a| and |b| match.
  der::Parser a_rdn_sequence(a);
  der::Parser b_rdn_sequence(b);
  while (a_rdn_sequence.HasMore() && b_rdn_sequence.HasMore()) {
    der::Parser a_rdn, b_rdn;
    if (!a_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &a_rdn) ||
        !b_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &b_rdn)) {
      return false;
    }
    if (!VerifyRdnMatch(&a_rdn, &b_rdn)) {
      return false;
    }
  }

  return true;
}